

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecsBase.hpp
# Opt level: O2

void __thiscall
sciplot::GridSpecsBase::GridSpecsBase(GridSpecsBase *this,void **vtt,string *tics,bool majortics)

{
  void *pvVar1;
  allocator<char> local_59;
  void **local_58;
  string local_50;
  
  local_58 = vtt + 1;
  LineSpecsOf<sciplot::GridSpecsBase>::LineSpecsOf
            (&this->super_LineSpecsOf<sciplot::GridSpecsBase>,local_58);
  DepthSpecsOf<sciplot::GridSpecsBase>::DepthSpecsOf
            (&this->super_DepthSpecsOf<sciplot::GridSpecsBase>,vtt + 3);
  pvVar1 = vtt[5];
  *(void **)&this->super_ShowSpecsOf<sciplot::GridSpecsBase> = pvVar1;
  *(void **)(&(this->super_ShowSpecsOf<sciplot::GridSpecsBase>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[6];
  (this->super_ShowSpecsOf<sciplot::GridSpecsBase>).m_show = true;
  pvVar1 = *vtt;
  *(void **)&this->super_LineSpecsOf<sciplot::GridSpecsBase> = pvVar1;
  *(void **)(&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[7];
  *(void **)&this->super_DepthSpecsOf<sciplot::GridSpecsBase> = vtt[8];
  *(void **)&this->super_ShowSpecsOf<sciplot::GridSpecsBase> = vtt[9];
  std::__cxx11::string::string((string *)&this->m_tics,(string *)tics);
  this->m_majortics = majortics;
  (this->super_ShowSpecsOf<sciplot::GridSpecsBase>).m_show = true;
  DepthSpecsOf<sciplot::GridSpecsBase>::back(&this->super_DepthSpecsOf<sciplot::GridSpecsBase>);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"#d6d7d9",&local_59);
  LineSpecsOf<sciplot::GridSpecsBase>::lineColor
            (&this->super_LineSpecsOf<sciplot::GridSpecsBase>,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  LineSpecsOf<sciplot::GridSpecsBase>::lineWidth(&this->super_LineSpecsOf<sciplot::GridSpecsBase>,1)
  ;
  LineSpecsOf<sciplot::GridSpecsBase>::lineType(&this->super_LineSpecsOf<sciplot::GridSpecsBase>,1);
  LineSpecsOf<sciplot::GridSpecsBase>::dashType(&this->super_LineSpecsOf<sciplot::GridSpecsBase>,0);
  return;
}

Assistant:

inline GridSpecsBase::GridSpecsBase(std::string tics, bool majortics)
: m_tics(tics), m_majortics(majortics)
{
    show(true);
    back();
    lineColor(internal::DEFAULT_GRID_LINECOLOR);
    lineWidth(internal::DEFAULT_GRID_LINEWIDTH);
    lineType(internal::DEFAULT_GRID_LINETYPE);
    dashType(internal::DEFAULT_GRID_DASHTYPE);
}